

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderSpectatorNotification(CHud *this)

{
  int iVar1;
  IClient *this_00;
  char *pcVar2;
  ITextRender *pIVar3;
  CTextCursor *in_RDI;
  float x;
  float fVar4;
  char *pText;
  int i;
  int NumPlayers;
  float in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int iVar5;
  int iVar6;
  
  if ((*(int *)&(*(IKernel **)&in_RDI->m_PageCountWhenDrawn)[0x3628]._vptr_IKernel != -1) &&
     (*(int *)&(*(IKernel **)&in_RDI->m_PageCountWhenDrawn)
               [(long)*(int *)&(*(IKernel **)&in_RDI->m_PageCountWhenDrawn)[0x3628]._vptr_IKernel *
                0xb6 + 0x909]._vptr_IKernel == -1)) {
    x = *(float *)&(*(IKernel **)&in_RDI->m_PageCountWhenDrawn)[0x3629]._vptr_IKernel + 5.0;
    this_00 = CComponent::Client((CComponent *)0x16912d);
    fVar4 = IClient::LocalTime(this_00);
    if (fVar4 <= x) {
      iVar6 = 0;
      for (iVar5 = 0; iVar5 < 0x40; iVar5 = iVar5 + 1) {
        if ((((ulong)(*(IKernel **)&in_RDI->m_PageCountWhenDrawn)[(long)iVar5 * 0xb6 + 0x95d].
                     _vptr_IKernel & 0x100000000) != 0) &&
           (*(int *)&(*(IKernel **)&in_RDI->m_PageCountWhenDrawn)[(long)iVar5 * 0xb6 + 0x909].
                     _vptr_IKernel != -1)) {
          iVar6 = iVar6 + 1;
        }
      }
      if (0 < iVar6) {
        pcVar2 = Localize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        if ((RenderSpectatorNotification()::s_Cursor == '\0') &&
           (iVar1 = __cxa_guard_acquire(&RenderSpectatorNotification()::s_Cursor), iVar1 != 0)) {
          CTextCursor::CTextCursor
                    ((CTextCursor *)CONCAT44(iVar6,iVar5),(float)((ulong)pcVar2 >> 0x20),(int)pcVar2
                    );
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderSpectatorNotification::s_Cursor,
                       &__dso_handle);
          __cxa_guard_release(&RenderSpectatorNotification()::s_Cursor);
        }
        CComponent::Graphics((CComponent *)0x16924b);
        IGraphics::ScreenAspect((IGraphics *)in_RDI);
        CTextCursor::MoveTo(in_RDI,x,in_stack_ffffffffffffffc8);
        RenderSpectatorNotification::s_Cursor.m_Align = 1;
        CLocalizationDatabase::Version(&g_Localization);
        CTextCursor::Reset(in_RDI,CONCAT44(x,in_stack_ffffffffffffffc8));
        pIVar3 = CComponent::TextRender((CComponent *)0x1692a5);
        (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
                  (pIVar3,&RenderSpectatorNotification::s_Cursor,pcVar2,0xffffffff);
      }
    }
  }
  return;
}

Assistant:

void CHud::RenderSpectatorNotification()
{
	if(m_pClient->m_LocalClientID != -1
		&& m_pClient->m_aClients[m_pClient->m_LocalClientID].m_Team == TEAM_SPECTATORS
		&& m_pClient->m_TeamChangeTime + 5.0f >= Client()->LocalTime())
	{
		// count non spectators
		int NumPlayers = 0;
		for(int i = 0; i < MAX_CLIENTS; i++)
			if(m_pClient->m_aClients[i].m_Active && m_pClient->m_aClients[i].m_Team != TEAM_SPECTATORS)
				NumPlayers++;
		
		if(NumPlayers > 0)
		{
			const char *pText = Localize("Click on a player or a flag to follow it");
			static CTextCursor s_Cursor(16.0f);
			s_Cursor.MoveTo(150 * Graphics()->ScreenAspect(), 30);
			s_Cursor.m_Align = TEXTALIGN_TC;
			s_Cursor.Reset(g_Localization.Version());
			TextRender()->TextOutlined(&s_Cursor, pText, -1);
		}
	}
}